

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2crossing_edge_query.cc
# Opt level: O0

void __thiscall
S2CrossingEdgeQuery::SplitUBound
          (S2CrossingEdgeQuery *this,R2Rect *edge_bound,double u,R2Rect *child_bounds)

{
  R1Interval *this_00;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  int diag;
  double v;
  R2Rect *child_bounds_local;
  double u_local;
  R2Rect *edge_bound_local;
  S2CrossingEdgeQuery *this_local;
  
  this_00 = R2Rect::operator[](edge_bound,1);
  dVar1 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                    ((BasicVector<Vector2,_double,_2UL> *)&this->a0_,0);
  dVar2 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                    ((BasicVector<Vector2,_double,_2UL> *)&this->a1_,0);
  dVar3 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                    ((BasicVector<Vector2,_double,_2UL> *)&this->a0_,1);
  dVar4 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                    ((BasicVector<Vector2,_double,_2UL> *)&this->a1_,1);
  dVar1 = S2::InterpolateDouble(u,dVar1,dVar2,dVar3,dVar4);
  dVar1 = R1Interval::Project(this_00,dVar1);
  dVar2 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                    ((BasicVector<Vector2,_double,_2UL> *)&this->a0_,0);
  dVar3 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                    ((BasicVector<Vector2,_double,_2UL> *)&this->a1_,0);
  dVar4 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                    ((BasicVector<Vector2,_double,_2UL> *)&this->a0_,1);
  dVar5 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                    ((BasicVector<Vector2,_double,_2UL> *)&this->a1_,1);
  SplitBound(edge_bound,0,u,(uint)(dVar3 < dVar2 != dVar5 < dVar4),dVar1,child_bounds);
  return;
}

Assistant:

void S2CrossingEdgeQuery::SplitUBound(const R2Rect& edge_bound, double u,
                                      R2Rect child_bounds[2]) const {
  // See comments in MutableS2ShapeIndex::ClipUBound.
  double v = edge_bound[1].Project(
      S2::InterpolateDouble(u, a0_[0], a1_[0], a0_[1], a1_[1]));

  // "diag_" indicates which diagonal of the bounding box is spanned by a0a1:
  // it is 0 if a0a1 has positive slope, and 1 if a0a1 has negative slope.
  int diag = (a0_[0] > a1_[0]) != (a0_[1] > a1_[1]);
  SplitBound(edge_bound, 0, u, diag, v, child_bounds);
}